

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O1

void __thiscall MODEL3D::three_dim_model::calculate_all_layer_bounds(three_dim_model *this)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  undefined7 uVar6;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  _Base_ptr p_Var7;
  _Self __tmp;
  _Rb_tree_color local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  _Base_ptr local_48;
  _Rb_tree_node_base *local_40;
  _Base_ptr local_38;
  
  initialize_layer_boundary_map(this);
  local_40 = &(this->polygons_map)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var5 = (this->polygons_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var5 != local_40) {
    this_00 = &this->layer_boundary_map;
    uVar6 = (undefined7)((ulong)local_40 >> 8);
    local_4c = (uint)CONCAT71(uVar6,1);
    local_50 = (uint)CONCAT71(uVar6,1);
    local_54 = (uint)CONCAT71(uVar6,1);
    local_58 = (uint)CONCAT71(uVar6,1);
    do {
      p_Var3 = p_Var5[1]._M_parent;
      local_38 = p_Var5[1]._M_left;
      if (p_Var3 != local_38) {
        do {
          p_Var2 = p_Var3->_M_parent;
          local_48 = p_Var3;
          for (p_Var7 = *(_Base_ptr *)p_Var3; p_Var7 != p_Var2;
              p_Var7 = (_Base_ptr)&p_Var7->field_0x4) {
            _Var1 = p_Var7->_M_color;
            if ((local_58 & 1) == 0) {
              local_5c = p_Var5[1]._M_color;
              pmVar4 = std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](this_00,(key_type *)&local_5c);
              if ((int)_Var1 <
                  *(pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start) {
                _Var1 = p_Var7->_M_color;
                local_5c = p_Var5[1]._M_color;
                pmVar4 = std::
                         map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ::operator[](this_00,(key_type *)&local_5c);
                *(pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start = _Var1;
              }
            }
            else {
              local_5c = p_Var5[1]._M_color;
              pmVar4 = std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](this_00,(key_type *)&local_5c);
              *(pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start = _Var1;
              local_58 = 0;
            }
            _Var1 = p_Var7->_M_color;
            if ((local_50 & 1) == 0) {
              local_5c = p_Var5[1]._M_color;
              pmVar4 = std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](this_00,(key_type *)&local_5c);
              if ((pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[2] < (int)_Var1) {
                _Var1 = p_Var7->_M_color;
                local_5c = p_Var5[1]._M_color;
                pmVar4 = std::
                         map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ::operator[](this_00,(key_type *)&local_5c);
                (pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[2] = _Var1;
              }
            }
            else {
              local_5c = p_Var5[1]._M_color;
              pmVar4 = std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](this_00,(key_type *)&local_5c);
              (pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[2] = _Var1;
              local_50 = 0;
            }
          }
          p_Var7 = *(_Base_ptr *)(local_48 + 1);
          for (p_Var3 = local_48->_M_right; p_Var3 != p_Var7; p_Var3 = (_Base_ptr)&p_Var3->field_0x4
              ) {
            _Var1 = p_Var3->_M_color;
            if ((local_54 & 1) == 0) {
              local_5c = p_Var5[1]._M_color;
              pmVar4 = std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](this_00,(key_type *)&local_5c);
              if ((int)_Var1 <
                  (pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[1]) {
                _Var1 = p_Var3->_M_color;
                local_5c = p_Var5[1]._M_color;
                pmVar4 = std::
                         map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ::operator[](this_00,(key_type *)&local_5c);
                (pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[1] = _Var1;
              }
            }
            else {
              local_5c = p_Var5[1]._M_color;
              pmVar4 = std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](this_00,(key_type *)&local_5c);
              (pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[1] = _Var1;
              local_54 = 0;
            }
            _Var1 = p_Var3->_M_color;
            if ((local_4c & 1) == 0) {
              local_5c = p_Var5[1]._M_color;
              pmVar4 = std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](this_00,(key_type *)&local_5c);
              if ((pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[3] < (int)_Var1) {
                _Var1 = p_Var3->_M_color;
                local_5c = p_Var5[1]._M_color;
                pmVar4 = std::
                         map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ::operator[](this_00,(key_type *)&local_5c);
                (pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[3] = _Var1;
              }
            }
            else {
              local_5c = p_Var5[1]._M_color;
              pmVar4 = std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](this_00,(key_type *)&local_5c);
              (pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[3] = _Var1;
              local_4c = 0;
            }
          }
          p_Var3 = (_Base_ptr)&local_48[1]._M_left;
        } while (p_Var3 != local_38);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_40);
  }
  return;
}

Assistant:

void MODEL3D::three_dim_model::calculate_all_layer_bounds()
{
    initialize_layer_boundary_map();
    bool empty[4] = {true, true, true, true};
    //scan through each layer
    auto layers_end = polygons_map.end();
    for (auto i = polygons_map.begin(); i != layers_end; i++)
    {
        //scan through each polygon
        auto polygons_vector_end = i->second.end();
        for (auto j = i->second.begin(); j != polygons_vector_end; j++)
        {
            //scan through each x point
            auto k_end = j->x.end();
            for (auto k = j->x.begin(); k != k_end; k++)
            {
                //min  x check
                if (empty[0]==true)
                {
                    layer_boundary_map[i->first][0] = *k;
                    empty[0] = false;
                }
                else if(*k < layer_boundary_map[i->first][0])
                {
                    layer_boundary_map[i->first][0] = *k;
                }
                //max x check
                if (empty[2]==true)
                {
                    layer_boundary_map[i->first][2] = *k;
                    empty[2] = false;
                }
                else if(*k > layer_boundary_map[i->first][2])
                {
                    layer_boundary_map[i->first][2] = *k;
                }
            }
            //scan through each y point
            auto n_end = j->y.end();
            for (auto n = j->y.begin(); n != n_end; n++)
            {
                //min  y check
                if (empty[1]==true)
                {
                    layer_boundary_map[i->first][1] = *n;
                    empty[1] = false;
                }
                else if(*n < layer_boundary_map[i->first][1])
                {
                    layer_boundary_map[i->first][1] = *n;
                }
                //max y check
                if (empty[3]==true)
                {
                    layer_boundary_map[i->first][3] = *n;
                    empty[3] = false;
                }
                else if(*n > layer_boundary_map[i->first][3])
                {
                    layer_boundary_map[i->first][3] = *n;
                }
            }
        }
    }
}